

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceCellUnionTarget::UpdateMinDistance
          (S2MinDistanceCellUnionTarget *this,S2Point *v0,S2Point *v1,S2MinDistance *min_dist)

{
  bool bVar1;
  S2MinDistanceTarget local_38;
  VType local_30;
  VType VStack_28;
  VType local_20;
  VType local_18;
  VType VStack_10;
  VType local_8;
  
  local_20 = v0->c_[2];
  local_30 = v0->c_[0];
  VStack_28 = v0->c_[1];
  local_18 = v1->c_[0];
  VStack_10 = v1->c_[1];
  local_8 = v1->c_[2];
  local_38._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_00304920;
  bVar1 = UpdateMinDistance(this,&local_38,min_dist);
  return bVar1;
}

Assistant:

bool S2MinDistanceCellUnionTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MinDistance* min_dist) {
  S2ClosestCellQuery::EdgeTarget target(v0, v1);
  return UpdateMinDistance(&target, min_dist);
}